

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  long *plVar4;
  N_Vector p_Var5;
  N_Vector p_Var6;
  long *plVar7;
  long lVar8;
  long lVar9;
  UserData paVar10;
  void *pvVar11;
  void *pvVar12;
  void *returnvalue;
  int iVar13;
  long lVar14;
  int retval;
  void *mem;
  sunrealtype tret;
  SUNContext ctx;
  N_Vector local_f8;
  UserData local_f0;
  sunrealtype *local_e8;
  void *local_e0;
  void *local_d8;
  undefined8 *local_d0;
  long *local_c8;
  N_Vector local_c0;
  double local_b8;
  double local_b0;
  long *local_a8;
  void *local_a0;
  long ncfn;
  long netf;
  long nre;
  long nje;
  long nnf;
  long nni;
  long nst;
  long nreLS;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  retval = SUNContext_Create(0,&ctx);
  iVar13 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    plVar4 = (long *)N_VNew_Serial(10,ctx);
    p_Var5 = (N_Vector)N_VClone(plVar4);
    p_Var6 = (N_Vector)N_VClone(plVar4);
    plVar7 = (long *)N_VNew_Serial(1,ctx);
    lVar8 = N_VCloneVectorArray(2,p_Var5);
    lVar9 = N_VCloneVectorArray(2,p_Var6);
    local_c8 = plVar7;
    local_d0 = (undefined8 *)N_VCloneVectorArray(2,plVar7);
    paVar10 = (UserData)malloc(0x48);
    paVar10->a = 0.5;
    paVar10->J1 = 1.0;
    paVar10->J2 = 2.0;
    paVar10->m1 = 1.0;
    local_e8 = paVar10->params;
    paVar10->params[0] = 1.0;
    paVar10->params[1] = 1.0;
    paVar10->m2 = 1.0;
    paVar10->l0 = 1.0;
    paVar10->F = 1.0;
    N_VConst(0,plVar4);
    lVar14 = *(long *)(*plVar4 + 0x10);
    *(undefined8 *)(lVar14 + 0x40) = 0;
    *(undefined8 *)(lVar14 + 0x48) = 0;
    *(undefined8 *)(lVar14 + 0x30) = 0;
    *(undefined8 *)(lVar14 + 0x38) = 0;
    puts("\nSlider-Crank example for IDAS:");
    local_f0 = paVar10;
    setIC(p_Var5,p_Var6,paVar10);
    for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
      N_VConst(0,*(undefined8 *)(lVar8 + lVar14 * 8));
      N_VConst(0,*(undefined8 *)(lVar9 + lVar14 * 8));
    }
    pvVar11 = (void *)IDACreate(ctx);
    mem = pvVar11;
    local_f8 = p_Var5;
    local_c0 = p_Var6;
    retval = IDAInit(0,pvVar11,ressc,p_Var5);
    retval = IDASStolerances(0xa0b5ed8d,0x3e7ad7f29abcaf48,pvVar11);
    retval = IDASetUserData(pvVar11,local_f0);
    retval = IDASetId(pvVar11,plVar4);
    iVar13 = 1;
    retval = IDASetSuppressAlg(pvVar11,1);
    retval = IDASetMaxNumSteps(pvVar11,20000);
    pvVar12 = (void *)SUNDenseMatrix(10,10,ctx);
    iVar2 = check_retval(pvVar12,"SUNDenseMatrix",0);
    if (iVar2 == 0) {
      local_a8 = plVar4;
      returnvalue = (void *)SUNLinSol_Dense(local_f8,pvVar12,ctx);
      iVar2 = check_retval(returnvalue,"SUNLinSol_Dense",0);
      if (iVar2 == 0) {
        retval = IDASetLinearSolver(pvVar11,returnvalue,pvVar12);
        iVar13 = 1;
        iVar2 = check_retval(&retval,"IDASetLinearSolver",1);
        if (iVar2 == 0) {
          iVar13 = 1;
          local_e0 = returnvalue;
          local_d8 = pvVar12;
          retval = IDASensInit(pvVar11,2,1,0,lVar8,lVar9);
          local_48 = *(undefined4 *)local_e8;
          uStack_44 = *(undefined4 *)((long)local_e8 + 4);
          uStack_40 = *(undefined4 *)(local_e8 + 1);
          uStack_3c = *(undefined4 *)((long)local_e8 + 0xc);
          retval = IDASetSensParams(pvVar11,local_e8,&local_48,0);
          retval = IDASensEEtolerances(pvVar11);
          IDASetSensErrCon(pvVar11,1);
          plVar4 = local_c8;
          N_VConst(0,local_c8);
          retval = IDAQuadInit(pvVar11,rhsQ,plVar4);
          retval = IDAQuadSStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,pvVar11);
          retval = IDASetQuadErrCon(pvVar11,1);
          puVar1 = local_d0;
          for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
            N_VConst(0,puVar1[lVar14]);
          }
          retval = IDAQuadSensInit(pvVar11,rhsQS,puVar1);
          local_58 = 0x3e45798ee2308c3a;
          uStack_50 = 0x3e45798ee2308c3a;
          retval = IDAQuadSensSStolerances(0xa0b5ed8d,pvVar11);
          retval = IDASetQuadSensErrCon(pvVar11,1);
          printf("\nForward integration ... ");
          retval = IDASolve(0,pvVar11,&tret,local_f8,local_c0,1);
          iVar2 = check_retval(&retval,"IDASolve",1);
          pvVar12 = local_d8;
          if (iVar2 == 0) {
            puts("done!");
            IDAGetNumSteps(pvVar11,&nst);
            IDAGetNumResEvals(pvVar11,&nre);
            IDAGetNumJacEvals(pvVar11,&nje);
            IDAGetNumNonlinSolvIters(pvVar11,&nni);
            IDAGetNumErrTestFails(pvVar11,&netf);
            IDAGetNumNonlinSolvConvFails(pvVar11,&nnf);
            IDAGetNumStepSolveFails(pvVar11,&ncfn);
            uVar3 = IDAGetNumLinResEvals(pvVar11,&nreLS);
            local_e8 = (sunrealtype *)CONCAT44(local_e8._4_4_,uVar3);
            puts("\nFinal Run Statistics: \n");
            printf("Number of steps                    = %ld\n",nst);
            printf("Number of residual evaluations     = %ld\n",nreLS + nre);
            printf("Number of Jacobian evaluations     = %ld\n",nje);
            printf("Number of nonlinear iterations     = %ld\n",nni);
            printf("Number of error test failures      = %ld\n",netf);
            printf("Number of nonlinear conv. failures = %ld\n",nnf);
            printf("Number of step solver failures     = %ld\n",ncfn);
            retval = (int)local_e8;
            iVar13 = 1;
            iVar2 = check_retval(&retval,"PrintFinalStats",1);
            plVar4 = local_c8;
            if (iVar2 == 0) {
              IDAGetQuad(pvVar11,&tret,local_c8);
              puts("--------------------------------------------");
              printf("  G = %24.16f\n",(int)**(undefined8 **)(*plVar4 + 0x10));
              puts("--------------------------------------------\n");
              puVar1 = local_d0;
              IDAGetQuadSens(pvVar11,&tret,local_d0);
              puts("-------------F O R W A R D------------------");
              printf("   dG/dp:  %12.4e %12.4e\n",(int)**(undefined8 **)(*(long *)*puVar1 + 0x10),
                     **(undefined8 **)(*(long *)puVar1[1] + 0x10));
              puts("--------------------------------------------\n");
              IDAFree(&mem);
              SUNLinSolFree(local_e0);
              SUNMatDestroy(pvVar12);
              paVar10 = local_f0;
              *(undefined4 *)local_f0->params = 0;
              *(undefined4 *)((long)local_f0->params + 4) = 0x3ff00000;
              *(undefined4 *)(local_f0->params + 1) = 0;
              *(undefined4 *)((long)local_f0->params + 0xc) = 0x3ff00000;
              mem = (void *)IDACreate(ctx);
              p_Var6 = local_c0;
              p_Var5 = local_f8;
              setIC(local_f8,local_c0,paVar10);
              retval = IDAInit(0,mem,ressc,p_Var5,p_Var6);
              retval = IDASStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,mem);
              retval = IDASetUserData(mem,paVar10);
              retval = IDASetId(mem,local_a8);
              iVar13 = 1;
              retval = IDASetSuppressAlg(mem,1);
              pvVar11 = (void *)SUNDenseMatrix(10,10,ctx);
              iVar2 = check_retval(pvVar11,"SUNDenseMatrix",0);
              if (iVar2 == 0) {
                pvVar12 = (void *)SUNLinSol_Dense(p_Var5,pvVar11,ctx);
                iVar2 = check_retval(pvVar12,"SUNLinSol_Dense",0);
                if (iVar2 == 0) {
                  retval = IDASetLinearSolver(mem,pvVar12,pvVar11);
                  iVar13 = 1;
                  iVar2 = check_retval(&retval,"IDASetLinearSolver",1);
                  plVar4 = local_c8;
                  if (iVar2 == 0) {
                    N_VConst(0,local_c8);
                    IDAQuadInit(mem,rhsQ,plVar4);
                    IDAQuadSStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,mem);
                    IDASetQuadErrCon(mem,1);
                    p_Var6 = local_c0;
                    IDASolve(0,mem,&tret,local_f8,local_c0,1);
                    IDAGetQuad(mem,&tret,plVar4);
                    p_Var5 = local_f8;
                    local_d8 = (void *)**(double **)(*plVar4 + 0x10);
                    local_f0->params[0] = local_f0->params[0] + -1e-05;
                    local_a0 = pvVar12;
                    setIC(local_f8,p_Var6,local_f0);
                    IDAReInit(0,mem,p_Var5,p_Var6);
                    N_VConst(0,plVar4);
                    IDAQuadReInit(mem,plVar4);
                    p_Var5 = local_f8;
                    IDASolve(0,mem,&tret,local_f8,p_Var6,1);
                    IDAGetQuad(mem,&tret,plVar4);
                    local_e8 = (sunrealtype *)**(double **)(*plVar4 + 0x10);
                    local_f0->params[0] = local_f0->params[0] + 2e-05;
                    setIC(p_Var5,p_Var6,local_f0);
                    IDAReInit(0,mem,p_Var5,p_Var6);
                    N_VConst(0,plVar4);
                    IDAQuadReInit(mem,plVar4);
                    IDASolve(0,mem,&tret,p_Var5,p_Var6,1);
                    IDAGetQuad(mem,&tret,plVar4);
                    local_e0 = (void *)**(double **)(*plVar4 + 0x10);
                    local_f0->params[0] = 1.0;
                    local_f0->params[1] = local_f0->params[1] + -1e-05;
                    setIC(p_Var5,p_Var6,local_f0);
                    IDAReInit(0,mem,p_Var5,p_Var6);
                    N_VConst(0,plVar4);
                    IDAQuadReInit(mem,plVar4);
                    p_Var5 = local_f8;
                    IDASolve(0,mem,&tret,local_f8,p_Var6,1);
                    IDAGetQuad(mem,&tret,plVar4);
                    local_b0 = **(double **)(*plVar4 + 0x10);
                    local_f0->params[1] = local_f0->params[1] + 2e-05;
                    setIC(p_Var5,p_Var6,local_f0);
                    IDAReInit(0,mem,p_Var5,p_Var6);
                    N_VConst(0,plVar4);
                    IDAQuadReInit(mem,plVar4);
                    IDASolve(0,mem,&tret,p_Var5,p_Var6,1);
                    IDAGetQuad(mem,&tret,plVar4);
                    local_b8 = **(double **)(*plVar4 + 0x10);
                    IDAFree(&mem);
                    SUNLinSolFree(local_a0);
                    SUNMatDestroy(pvVar11);
                    puts("\n\n   Checking using Finite Differences \n");
                    puts("---------------BACKWARD------------------");
                    printf("   dG/dp:  %12.4e %12.4e\n",
                           SUB84(((double)local_d8 - (double)local_e8) / 1e-05,0),
                           ((double)local_d8 - local_b0) / 1e-05);
                    puts("-----------------------------------------\n");
                    puts("---------------FORWARD-------------------");
                    printf("   dG/dp:  %12.4e %12.4e\n",
                           SUB84(((double)local_e0 - (double)local_d8) / 1e-05,0),
                           (local_b8 - (double)local_d8) / 1e-05);
                    puts("-----------------------------------------\n");
                    puts("--------------CENTERED-------------------");
                    printf("   dG/dp:  %12.4e %12.4e\n",
                           SUB84(((double)local_e0 - (double)local_e8) / 2e-05,0),
                           (local_b8 - local_b0) / 2e-05);
                    puts("-----------------------------------------\n");
                    free(local_f0);
                    N_VDestroy(local_a8);
                    N_VDestroy(local_f8);
                    N_VDestroy(p_Var6);
                    N_VDestroy(plVar4);
                    N_VDestroyVectorArray(lVar8,2);
                    N_VDestroyVectorArray(lVar9,2);
                    N_VDestroyVectorArray(local_d0,2);
                    SUNContext_Free(&ctx);
                    iVar13 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int main(void)
{
  UserData data;

  void* mem;
  N_Vector yy, yp, id, q, *yyS, *ypS, *qS;
  sunrealtype tret;
  sunrealtype pbar[2];
  sunrealtype dp, G, Gm[2], Gp[2];
  int retval, is;
  sunrealtype atolS[NP];
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  A  = NULL;
  LS = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  id = N_VNew_Serial(NEQ, ctx);
  yy = N_VClone(id);
  yp = N_VClone(id);
  q  = N_VNew_Serial(1, ctx);

  yyS = N_VCloneVectorArray(NP, yy);
  ypS = N_VCloneVectorArray(NP, yp);
  qS  = N_VCloneVectorArray(NP, q);

  data = (UserData)malloc(sizeof *data);

  data->a         = 0.5; /* half-length of crank */
  data->J1        = 1.0; /* crank moment of inertia */
  data->m2        = 1.0; /* mass of connecting rod */
  data->m1        = 1.0;
  data->J2        = 2.0; /* moment of inertia of connecting rod */
  data->params[0] = 1.0; /* spring constant */
  data->params[1] = 1.0; /* damper constant */
  data->l0        = 1.0; /* spring free length */
  data->F         = 1.0; /* external constant force */

  N_VConst(ONE, id);
  NV_Ith_S(id, 9) = ZERO;
  NV_Ith_S(id, 8) = ZERO;
  NV_Ith_S(id, 7) = ZERO;
  NV_Ith_S(id, 6) = ZERO;

  printf("\nSlider-Crank example for IDAS:\n");

  /* Consistent IC*/
  setIC(yy, yp, data);

  for (is = 0; is < NP; is++)
  {
    N_VConst(ZERO, yyS[is]);
    N_VConst(ZERO, ypS[is]);
  }

  /* IDA initialization */
  mem    = IDACreate(ctx);
  retval = IDAInit(mem, ressc, TBEGIN, yy, yp);
  retval = IDASStolerances(mem, RTOLF, ATOLF);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);
  retval = IDASetMaxNumSteps(mem, 20000);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval  = IDASensInit(mem, NP, IDA_SIMULTANEOUS, NULL, yyS, ypS);
  pbar[0] = data->params[0];
  pbar[1] = data->params[1];
  retval  = IDASetSensParams(mem, data->params, pbar, NULL);
  retval  = IDASensEEtolerances(mem);
  IDASetSensErrCon(mem, SUNTRUE);

  N_VConst(ZERO, q);
  retval = IDAQuadInit(mem, rhsQ, q);
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  retval = IDASetQuadErrCon(mem, SUNTRUE);

  for (is = 0; is < NP; is++) { N_VConst(ZERO, qS[is]); }
  retval   = IDAQuadSensInit(mem, rhsQS, qS);
  atolS[0] = atolS[1] = ATOLQ;
  retval              = IDAQuadSensSStolerances(mem, RTOLQ, atolS);
  retval              = IDASetQuadSensErrCon(mem, SUNTRUE);

  /* Perform forward run */
  printf("\nForward integration ... ");

  retval = IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  if (check_retval(&retval, "IDASolve", 1)) { return (1); }

  printf("done!\n");

  retval = PrintFinalStats(mem);
  if (check_retval(&retval, "PrintFinalStats", 1)) { return (1); }

  IDAGetQuad(mem, &tret, q);
  printf("--------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  G = %24.16Lf\n", Ith(q, 1));
#else
  printf("  G = %24.16f\n", Ith(q, 1));
#endif
  printf("--------------------------------------------\n\n");

  IDAGetQuadSens(mem, &tret, qS);
  printf("-------------F O R W A R D------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(qS[0], 1), Ith(qS[1], 1));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(qS[0], 1), Ith(qS[1], 1));
#endif
  printf("--------------------------------------------\n\n");

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  /* Finite differences for dG/dp */
  dp              = 0.00001;
  data->params[0] = ONE;
  data->params[1] = ONE;

  mem = IDACreate(ctx);

  setIC(yy, yp, data);
  retval = IDAInit(mem, ressc, TBEGIN, yy, yp);
  retval = IDASStolerances(mem, RTOLFD, ATOLFD);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  N_VConst(ZERO, q);
  IDAQuadInit(mem, rhsQ, q);
  IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  IDASetQuadErrCon(mem, SUNTRUE);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);

  IDAGetQuad(mem, &tret, q);
  G = Ith(q, 1);
  /*printf("  G  =%12.6e\n", Ith(q,1));*/

  /******************************
  * BACKWARD for k
  ******************************/
  data->params[0] -= dp;
  setIC(yy, yp, data);

  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gm[0] = Ith(q, 1);
  /*printf("Gm[0]=%12.6e\n", Ith(q,1));*/

  /****************************
  * FORWARD for k *
  ****************************/
  data->params[0] += (TWO * dp);
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gp[0] = Ith(q, 1);
  /*printf("Gp[0]=%12.6e\n", Ith(q,1));*/

  /* Backward for c */
  data->params[0] = ONE;
  data->params[1] -= dp;
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gm[1] = Ith(q, 1);

  /* Forward for c */
  data->params[1] += (TWO * dp);
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gp[1] = Ith(q, 1);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  printf("\n\n   Checking using Finite Differences \n\n");

  printf("---------------BACKWARD------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (G - Gm[0]) / dp, (G - Gm[1]) / dp);
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (G - Gm[0]) / dp, (G - Gm[1]) / dp);
#endif
  printf("-----------------------------------------\n\n");

  printf("---------------FORWARD-------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (Gp[0] - G) / dp, (Gp[1] - G) / dp);
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (Gp[0] - G) / dp, (Gp[1] - G) / dp);
#endif
  printf("-----------------------------------------\n\n");

  printf("--------------CENTERED-------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (Gp[0] - Gm[0]) / (TWO * dp),
         (Gp[1] - Gm[1]) / (TWO * dp));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (Gp[0] - Gm[0]) / (TWO * dp),
         (Gp[1] - Gm[1]) / (TWO * dp));
#endif
  printf("-----------------------------------------\n\n");

  /* Free memory */
  free(data);

  N_VDestroy(id);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);

  N_VDestroyVectorArray(yyS, NP);
  N_VDestroyVectorArray(ypS, NP);
  N_VDestroyVectorArray(qS, NP);

  SUNContext_Free(&ctx);

  return (0);
}